

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall Lowerer::GenerateFastBrBool(Lowerer *this,BranchInstr *instr)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 baseOpnd;
  bool bVar3;
  IRType IVar4;
  ObjectType OVar5;
  OpCode OVar6;
  uint32 uVar7;
  undefined4 *puVar8;
  Opnd *pOVar9;
  Instr *pIVar10;
  IndirOpnd *pIVar11;
  IntConstOpnd *pIVar12;
  BranchInstr *this_00;
  LabelInstr *pLVar13;
  byte local_249;
  LabelInstr *local_1a8;
  LabelInstr *local_1a0;
  Instr *callInstr;
  AutoReuseOpnd autoReuseToBoolDst;
  RegOpnd *toBoolDst;
  AutoReuseOpnd autoReuseR1;
  RegOpnd *srcType;
  LabelInstr *local_128;
  LabelInstr *notStringLabel;
  LabelInstr *local_118;
  LabelInstr *notBooleanLabel;
  anon_class_48_6_08bc57de EnsureObjectTest;
  LabelInstr *pLStack_d8;
  bool _didObjectTest;
  LabelInstr *labelHelper;
  RegOpnd *local_c8;
  RegOpnd *floatOpnd;
  LabelInstr *notFloatLabel;
  bool checkedForTaggedFloat;
  LabelInstr *pLStack_b0;
  bool generateFloatTest;
  LabelInstr *notTaggedIntLabel;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_a0;
  bool checkedForTaggedInt;
  bool isNotInt;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_9c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_9a;
  LabelInstr *local_98;
  LabelInstr *lastLabelBeforeHelper;
  LabelInstr *pLStack_88;
  OpCode compareWithFalseBranchToTargetOpCode;
  LabelInstr *labelTrue;
  LabelInstr *labelFalse;
  bool branchOnFalse;
  LabelInstr *pLStack_70;
  LabelInstr *labelFallthrough;
  LabelInstr *labelTarget;
  ValueType srcValueType;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4a;
  undefined1 local_48 [6];
  ValueType srcOriginalValueType;
  AutoReuseOpnd autoReuseSrc;
  RegOpnd *src;
  Func *func;
  BranchInstr *instr_local;
  Lowerer *this_local;
  
  func = (Func *)instr;
  instr_local = (BranchInstr *)this;
  if (instr == (BranchInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5fc9,"(instr)","instr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if (((short)func->constructorCacheCount != 0xe) && ((short)func->constructorCacheCount != 0xf)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5fca,
                       "(instr->m_opcode == Js::OpCode::BrFalse_A || instr->m_opcode == Js::OpCode::BrTrue_A)"
                       ,
                       "instr->m_opcode == Js::OpCode::BrFalse_A || instr->m_opcode == Js::OpCode::BrTrue_A"
                      );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  src = (RegOpnd *)func->m_workItem;
  pOVar9 = IR::Instr::GetSrc1((Instr *)func);
  bVar3 = IR::Opnd::IsRegOpnd(pOVar9);
  if (!bVar3) {
    pIVar10 = IR::Instr::HoistSrc1((Instr *)func,Ld_A,RegNOREG,(StackSym *)0x0);
    LowererMD::ChangeToAssign(pIVar10);
  }
  pOVar9 = IR::Instr::GetSrc1((Instr *)func);
  pOVar9 = IR::Opnd::Copy(pOVar9,(Func *)src);
  autoReuseSrc._16_8_ = IR::Opnd::AsRegOpnd(pOVar9);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)local_48,(Opnd *)autoReuseSrc._16_8_,(Func *)src,true);
  labelTarget._2_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType((Opnd *)autoReuseSrc._16_8_);
  local_4a.field_0 = labelTarget._2_2_;
  labelFallthrough = IR::BranchInstr::GetTarget((BranchInstr *)func);
  pLStack_70 = IR::Instr::GetOrCreateContinueLabel((Instr *)func,false);
  if (labelFallthrough == pLStack_70) {
    IR::Instr::Remove((Instr *)func);
    this_local._7_1_ = 0;
    labelFalse._4_4_ = 1;
  }
  else {
    labelFalse._3_1_ = (short)func->constructorCacheCount == 0xe;
    local_1a0 = pLStack_70;
    if ((bool)labelFalse._3_1_) {
      local_1a0 = labelFallthrough;
    }
    labelTrue = local_1a0;
    local_1a8 = pLStack_70;
    if (!(bool)labelFalse._3_1_) {
      local_1a8 = labelFallthrough;
    }
    pLStack_88 = local_1a8;
    lastLabelBeforeHelper._6_2_ = labelFalse._3_1_ ^ BrNeq_A;
    local_98 = (LabelInstr *)0x0;
    pOVar9 = IR::Instr::GetSrc1((Instr *)func);
    IVar4 = IR::Opnd::GetType(pOVar9);
    if (IVar4 == TyFloat64) {
      pOVar9 = IR::Instr::GetSrc1((Instr *)func);
      InsertFloatCheckForZeroOrNanBranch
                (this,pOVar9,(bool)(labelFalse._3_1_ & 1),labelFallthrough,pLStack_70,(Instr *)func)
      ;
      InsertBranch(Br,pLStack_70,(Instr *)func);
      IR::Instr::Remove((Instr *)func);
      this_local._7_1_ = 0;
      labelFalse._4_4_ = 1;
    }
    else {
      bVar3 = ValueType::HasBeenNull((ValueType *)((long)&labelTarget + 2));
      if ((bVar3) || (bVar3 = ValueType::IsUninitialized((ValueType *)&local_4a.field_0), bVar3)) {
        bVar3 = ValueType::IsNull((ValueType *)((long)&labelTarget + 2));
        uVar2 = autoReuseSrc._16_8_;
        if (bVar3) {
          InsertBranch(Br,labelTrue,(Instr *)func);
          bVar3 = IR::Instr::IsBranchInstr((Instr *)func->m_scriptContextInfo);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x5ffa,"(instr->m_prev->IsBranchInstr())",
                               "instr->m_prev->IsBranchInstr()");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          IR::Instr::Remove((Instr *)func);
          this_local._7_1_ = 0;
          labelFalse._4_4_ = 1;
          goto LAB_007a9047;
        }
        pOVar9 = LoadLibraryValueOpnd(this,(Instr *)func,ValueNull);
        InsertCompareBranch(this,(Opnd *)uVar2,pOVar9,BrEq_A,labelTrue,(Instr *)func,false);
        uVar2 = autoReuseSrc._16_8_;
        _checkedForTaggedInt = ValueType::Null.field_0;
        local_9c.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::SetIsNotAnyOf((ValueType *)((long)&labelTarget + 2),ValueType::Null);
        local_9a.field_0 = local_9c.field_0;
        labelTarget._2_2_ = local_9c.field_0;
        IR::Opnd::SetValueType((Opnd *)uVar2,(ValueType)local_9c.field_0);
      }
      bVar3 = ValueType::HasBeenUndefined((ValueType *)((long)&labelTarget + 2));
      if ((bVar3) || (bVar3 = ValueType::IsUninitialized((ValueType *)&local_4a.field_0), bVar3)) {
        bVar3 = ValueType::IsUndefined((ValueType *)((long)&labelTarget + 2));
        uVar2 = autoReuseSrc._16_8_;
        if (bVar3) {
          InsertBranch(Br,labelTrue,(Instr *)func);
          bVar3 = IR::Instr::IsBranchInstr((Instr *)func->m_scriptContextInfo);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x6016,"(instr->m_prev->IsBranchInstr())",
                               "instr->m_prev->IsBranchInstr()");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          IR::Instr::Remove((Instr *)func);
          this_local._7_1_ = 0;
          labelFalse._4_4_ = 1;
          goto LAB_007a9047;
        }
        pOVar9 = LoadLibraryValueOpnd(this,(Instr *)func,ValueUndefined);
        InsertCompareBranch(this,(Opnd *)uVar2,pOVar9,BrEq_A,labelTrue,(Instr *)func,false);
        uVar2 = autoReuseSrc._16_8_;
        notTaggedIntLabel._4_2_ = ValueType::Undefined.field_0;
        notTaggedIntLabel._6_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::SetIsNotAnyOf((ValueType *)((long)&labelTarget + 2),ValueType::Undefined);
        local_a0.field_0 = notTaggedIntLabel._6_2_;
        labelTarget._2_2_ = notTaggedIntLabel._6_2_;
        IR::Opnd::SetValueType((Opnd *)uVar2,(ValueType)notTaggedIntLabel._6_2_);
      }
      notTaggedIntLabel._2_1_ = IR::Opnd::IsNotInt((Opnd *)autoReuseSrc._16_8_);
      notTaggedIntLabel._3_1_ = notTaggedIntLabel._2_1_;
      bVar3 = ValueType::HasBeenInt((ValueType *)((long)&labelTarget + 2));
      if ((((bVar3) ||
           (bVar3 = ValueType::HasBeenUnknownNumber((ValueType *)((long)&labelTarget + 2)), bVar3))
          || (bVar3 = ValueType::IsUninitialized((ValueType *)&local_4a.field_0), bVar3)) &&
         ((notTaggedIntLabel._3_1_ & 1) == 0)) {
        notTaggedIntLabel._2_1_ = 1;
        pLStack_b0 = (LabelInstr *)0x0;
        bVar3 = IR::Opnd::IsTaggedInt((Opnd *)autoReuseSrc._16_8_);
        if (!bVar3) {
          pLStack_b0 = IR::LabelInstr::New(Label,(Func *)src,false);
          LowererMD::GenerateSmIntTest
                    (&this->m_lowererMD,(Opnd *)autoReuseSrc._16_8_,(Instr *)func,pLStack_b0,
                     (Instr **)0x0,false);
        }
        LowererMD::GenerateTaggedZeroTest
                  (&this->m_lowererMD,(Opnd *)autoReuseSrc._16_8_,(Instr *)func,(LabelInstr *)0x0);
        InsertBranch(lastLabelBeforeHelper._6_2_,labelFallthrough,(Instr *)func);
        bVar3 = IR::Opnd::IsTaggedInt((Opnd *)autoReuseSrc._16_8_);
        if (bVar3) {
          bVar3 = IR::Instr::IsBranchInstr((Instr *)func->m_scriptContextInfo);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x6044,"(instr->m_prev->IsBranchInstr())",
                               "instr->m_prev->IsBranchInstr()");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          IR::Instr::Remove((Instr *)func);
          this_local._7_1_ = 0;
          labelFalse._4_4_ = 1;
          goto LAB_007a9047;
        }
        InsertBranch(Br,pLStack_70,(Instr *)func);
        if (pLStack_b0 != (LabelInstr *)0x0) {
          IR::Instr::InsertBefore((Instr *)func,&pLStack_b0->super_Instr);
          local_98 = pLStack_b0;
        }
      }
      notFloatLabel._7_1_ = ValueType::IsLikelyFloat((ValueType *)((long)&labelTarget + 2));
      notFloatLabel._6_1_ = ValueType::IsNotNumber((ValueType *)((long)&labelTarget + 2));
      if ((notFloatLabel._7_1_ & 1) != 0) {
        floatOpnd = (RegOpnd *)IR::LabelInstr::New(Label,(Func *)src,false);
        if ((notTaggedIntLabel._2_1_ & 1) == 0) {
          notTaggedIntLabel._2_1_ = 1;
          LowererMD::GenerateSmIntTest
                    (&this->m_lowererMD,(Opnd *)autoReuseSrc._16_8_,(Instr *)func,
                     (LabelInstr *)floatOpnd,(Instr **)0x0,true);
        }
        notFloatLabel._6_1_ = 1;
        local_c8 = LowererMD::CheckFloatAndUntag
                             (&this->m_lowererMD,(RegOpnd *)autoReuseSrc._16_8_,(Instr *)func,
                              (LabelInstr *)floatOpnd);
        InsertFloatCheckForZeroOrNanBranch
                  (this,&local_c8->super_Opnd,(bool)(labelFalse._3_1_ & 1),labelFallthrough,
                   pLStack_70,(Instr *)func);
        InsertBranch(Br,pLStack_70,(Instr *)func);
        IR::Instr::InsertBefore((Instr *)func,(Instr *)floatOpnd);
        uVar2 = autoReuseSrc._16_8_;
        local_98 = (LabelInstr *)floatOpnd;
        labelHelper._2_2_ = ValueType::AnyNumber.field_0;
        labelHelper._4_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::SetIsNotAnyOf((ValueType *)((long)&labelTarget + 2),ValueType::AnyNumber);
        labelHelper._6_2_ = labelHelper._4_2_;
        labelTarget._2_2_ = labelHelper._4_2_;
        IR::Opnd::SetValueType((Opnd *)uVar2,(ValueType)labelHelper._4_2_);
      }
      pLStack_d8 = (LabelInstr *)0x0;
      local_249 = 0;
      if ((notTaggedIntLabel._2_1_ & 1) != 0) {
        local_249 = notFloatLabel._6_1_;
      }
      EnsureObjectTest.instr._7_1_ = local_249 & 1;
      notBooleanLabel = (LabelInstr *)((long)&EnsureObjectTest.instr + 7);
      EnsureObjectTest._didObjectTest = (bool *)&stack0xffffffffffffff28;
      EnsureObjectTest.labelHelper = (LabelInstr **)&src;
      EnsureObjectTest.this = (Lowerer *)&autoReuseSrc.autoDelete;
      EnsureObjectTest.src = (RegOpnd **)&func;
      EnsureObjectTest.func = &this->m_func;
      bVar3 = ValueType::HasBeenBoolean((ValueType *)((long)&labelTarget + 2));
      if ((bVar3) || (bVar3 = ValueType::IsUninitialized((ValueType *)&local_4a.field_0), bVar3)) {
        local_118 = (LabelInstr *)0x0;
        bVar3 = ValueType::IsBoolean((ValueType *)((long)&labelTarget + 2));
        if (!bVar3) {
          GenerateFastBrBool::anon_class_48_6_08bc57de::operator()
                    ((anon_class_48_6_08bc57de *)&notBooleanLabel);
          local_118 = IR::LabelInstr::New(Label,(Func *)src,false);
          pIVar11 = IR::IndirOpnd::New((RegOpnd *)autoReuseSrc._16_8_,0,TyUint64,(Func *)src,false);
          pOVar9 = LoadVTableValueOpnd(this,(Instr *)func,VtableJavascriptBoolean);
          InsertCompareBranch(this,&pIVar11->super_Opnd,pOVar9,BrNeq_A,local_118,(Instr *)func,false
                             );
        }
        uVar2 = autoReuseSrc._16_8_;
        pOVar9 = LoadLibraryValueOpnd(this,(Instr *)func,ValueFalse);
        InsertCompareBranch(this,(Opnd *)uVar2,pOVar9,lastLabelBeforeHelper._6_2_,labelFallthrough,
                            (Instr *)func,false);
        bVar3 = ValueType::IsBoolean((ValueType *)((long)&labelTarget + 2));
        if (bVar3) {
          if (pLStack_d8 != (LabelInstr *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x60bc,"(!labelHelper)","!labelHelper");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          bVar3 = IR::Instr::IsBranchInstr((Instr *)func->m_scriptContextInfo);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x60bd,"(instr->m_prev->IsBranchInstr())",
                               "instr->m_prev->IsBranchInstr()");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          IR::Instr::Remove((Instr *)func);
          this_local._7_1_ = 0;
          labelFalse._4_4_ = 1;
          goto LAB_007a9047;
        }
        InsertBranch(Br,pLStack_70,(Instr *)func);
        if (local_118 != (LabelInstr *)0x0) {
          IR::Instr::InsertBefore((Instr *)func,&local_118->super_Instr);
          local_98 = local_118;
        }
        uVar2 = autoReuseSrc._16_8_;
        labelTarget._2_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::SetIsNotAnyOf((ValueType *)((long)&labelTarget + 2),ValueType::Boolean);
        IR::Opnd::SetValueType((Opnd *)uVar2,(ValueType)labelTarget._2_2_);
      }
      bVar3 = ValueType::HasBeenString((ValueType *)((long)&labelTarget + 2));
      if (bVar3) {
        local_128 = (LabelInstr *)0x0;
        bVar3 = ValueType::IsString((ValueType *)((long)&labelTarget + 2));
        if (!bVar3) {
          GenerateFastBrBool::anon_class_48_6_08bc57de::operator()
                    ((anon_class_48_6_08bc57de *)&notBooleanLabel);
          local_128 = IR::LabelInstr::New(Label,(Func *)src,false);
          GenerateStringTest(this,(RegOpnd *)autoReuseSrc._16_8_,(Instr *)func,local_128,
                             (LabelInstr *)0x0,false);
        }
        uVar2 = autoReuseSrc._16_8_;
        uVar7 = Js::JavascriptString::GetOffsetOfcharLength();
        pIVar11 = IR::IndirOpnd::New((RegOpnd *)uVar2,uVar7,TyUint32,(Func *)src,false);
        pIVar12 = IR::IntConstOpnd::New(0,TyUint32,(Func *)src,true);
        InsertCompareBranch(this,&pIVar11->super_Opnd,&pIVar12->super_Opnd,
                            lastLabelBeforeHelper._6_2_,labelFallthrough,(Instr *)func,false);
        bVar3 = ValueType::IsString((ValueType *)((long)&labelTarget + 2));
        if (bVar3) {
          if (pLStack_d8 != (LabelInstr *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x60e8,"(!labelHelper)","!labelHelper");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          bVar3 = IR::Instr::IsBranchInstr((Instr *)func->m_scriptContextInfo);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x60e9,"(instr->m_prev->IsBranchInstr())",
                               "instr->m_prev->IsBranchInstr()");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          IR::Instr::Remove((Instr *)func);
          this_local._7_1_ = 0;
          labelFalse._4_4_ = 1;
          goto LAB_007a9047;
        }
        InsertBranch(Br,pLStack_70,(Instr *)func);
        if (local_128 != (LabelInstr *)0x0) {
          IR::Instr::InsertBefore((Instr *)func,&local_128->super_Instr);
          local_98 = local_128;
        }
        uVar2 = autoReuseSrc._16_8_;
        labelTarget._2_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::SetIsNotAnyOf((ValueType *)((long)&labelTarget + 2),ValueType::String);
        IR::Opnd::SetValueType((Opnd *)uVar2,(ValueType)labelTarget._2_2_);
      }
      bVar3 = ValueType::IsLikelyObject((ValueType *)((long)&labelTarget + 2));
      if (bVar3) {
        bVar3 = ValueType::IsObject((ValueType *)((long)&labelTarget + 2));
        if (bVar3) {
          OVar5 = ValueType::GetObjectType((ValueType *)((long)&labelTarget + 2));
          if (Object < OVar5) {
            InsertBranch(Br,pLStack_88,(Instr *)func);
            if (pLStack_d8 != (LabelInstr *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x6108,"(!labelHelper)","!labelHelper");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 0;
            }
            bVar3 = IR::Instr::IsBranchInstr((Instr *)func->m_scriptContextInfo);
            if (!bVar3) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x6109,"(instr->m_prev->IsBranchInstr())",
                                 "instr->m_prev->IsBranchInstr()");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 0;
            }
            IR::Instr::Remove((Instr *)func);
            this_local._7_1_ = 0;
            labelFalse._4_4_ = 1;
            goto LAB_007a9047;
          }
        }
        else {
          GenerateFastBrBool::anon_class_48_6_08bc57de::operator()
                    ((anon_class_48_6_08bc57de *)&notBooleanLabel);
        }
        autoReuseR1._16_8_ = IR::RegOpnd::New(TyUint64,(Func *)src);
        IR::AutoReuseOpnd::AutoReuseOpnd
                  ((AutoReuseOpnd *)&toBoolDst,(Opnd *)autoReuseR1._16_8_,(Func *)src,true);
        baseOpnd = autoReuseSrc._16_8_;
        uVar2 = autoReuseR1._16_8_;
        uVar7 = Js::RecyclableObject::GetOffsetOfType();
        pIVar11 = IR::IndirOpnd::New((RegOpnd *)baseOpnd,uVar7,TyUint64,(Func *)src,false);
        InsertMove((Opnd *)uVar2,&pIVar11->super_Opnd,(Instr *)func,true);
        uVar2 = autoReuseR1._16_8_;
        uVar7 = Js::Type::GetOffsetOfFlags();
        pIVar11 = IR::IndirOpnd::New((RegOpnd *)uVar2,uVar7,TyUint8,(Func *)src,false);
        pIVar12 = IR::IntConstOpnd::New(2,TyUint8,(Func *)src,false);
        InsertTestBranch(&pIVar11->super_Opnd,&pIVar12->super_Opnd,BrNeq_A,labelTrue,(Instr *)func);
        uVar2 = autoReuseR1._16_8_;
        uVar7 = Js::Type::GetOffsetOfTypeId();
        pIVar11 = IR::IndirOpnd::New((RegOpnd *)uVar2,uVar7,TyInt32,(Func *)src,false);
        pIVar12 = IR::IntConstOpnd::New(0x16,TyInt32,(Func *)src,false);
        InsertCompareBranch(this,&pIVar11->super_Opnd,&pIVar12->super_Opnd,BrGt_A,true,pLStack_88,
                            (Instr *)func,false);
        if (pLStack_d8 == (LabelInstr *)0x0) {
          pLStack_d8 = IR::LabelInstr::New(Label,(Func *)src,true);
        }
        local_98 = (LabelInstr *)0x0;
        IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&toBoolDst);
      }
      if (local_98 != (LabelInstr *)0x0) {
        if ((LabelInstr *)func->m_scriptContextInfo != local_98) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x6138,"(instr->m_prev == lastLabelBeforeHelper)",
                             "instr->m_prev == lastLabelBeforeHelper");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        local_98->field_0x78 = local_98->field_0x78 & 0xfd | 2;
      }
      if (pLStack_d8 != (LabelInstr *)0x0) {
        if (((byte)pLStack_d8->field_0x78 >> 1 & 1) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x613d,"(labelHelper->isOpHelper)","labelHelper->isOpHelper");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        IR::Instr::InsertBefore((Instr *)func,&pLStack_d8->super_Instr);
      }
      autoReuseToBoolDst._16_8_ = IR::RegOpnd::New(TyInt32,(Func *)src);
      IR::AutoReuseOpnd::AutoReuseOpnd
                ((AutoReuseOpnd *)&callInstr,(Opnd *)autoReuseToBoolDst._16_8_,(Func *)src,true);
      uVar2 = autoReuseToBoolDst._16_8_;
      pOVar9 = IR::Instr::GetSrc1((Instr *)func);
      pIVar10 = IR::Instr::New(Call,(Opnd *)uVar2,pOVar9,(Func *)src);
      IR::Instr::InsertBefore((Instr *)func,pIVar10);
      LowerUnaryHelperMem(this,pIVar10,HelperConv_ToBoolean,(Opnd *)0x0);
      InsertTest((Opnd *)autoReuseToBoolDst._16_8_,(Opnd *)autoReuseToBoolDst._16_8_,(Instr *)func);
      bVar3 = IR::Instr::IsBranchInstr((Instr *)func);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x614c,"(instr->IsBranchInstr())","instr->IsBranchInstr()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      IR::Instr::FreeSrc1((Instr *)func);
      OVar6 = LowererMD::MDBranchOpcode(lastLabelBeforeHelper._6_2_);
      *(OpCode *)&func->constructorCacheCount = OVar6;
      this_00 = IR::Instr::AsBranchInstr((Instr *)func);
      pLVar13 = IR::BranchInstr::GetTarget(this_00);
      if (pLVar13 != labelFallthrough) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x614f,"(instr->AsBranchInstr()->GetTarget() == labelTarget)",
                           "instr->AsBranchInstr()->GetTarget() == labelTarget");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      this_local._7_1_ = 0;
      labelFalse._4_4_ = 1;
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&callInstr);
    }
  }
LAB_007a9047:
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_48);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Lowerer::GenerateFastBrBool(IR::BranchInstr *const instr)
{
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::BrFalse_A || instr->m_opcode == Js::OpCode::BrTrue_A);

    Func *const func = instr->m_func;

    if(!instr->GetSrc1()->IsRegOpnd())
    {
        LowererMD::ChangeToAssign(instr->HoistSrc1(Js::OpCode::Ld_A));
    }
    IR::RegOpnd *const src = instr->GetSrc1()->Copy(func)->AsRegOpnd();
    const IR::AutoReuseOpnd autoReuseSrc(src, func);
    const ValueType srcOriginalValueType(src->GetValueType());
    ValueType srcValueType(srcOriginalValueType);

    IR::LabelInstr *const labelTarget = instr->GetTarget();
    IR::LabelInstr *const labelFallthrough = instr->GetOrCreateContinueLabel();
    if(labelTarget == labelFallthrough)
    {
        // Nothing to do
        instr->Remove();
        return false;
    }

    const bool branchOnFalse = instr->m_opcode == Js::OpCode::BrFalse_A;
    IR::LabelInstr *const labelFalse = branchOnFalse ? labelTarget : labelFallthrough;
    IR::LabelInstr *const labelTrue = branchOnFalse ? labelFallthrough : labelTarget;
    const Js::OpCode compareWithFalseBranchToTargetOpCode = branchOnFalse ? Js::OpCode::BrEq_A : Js::OpCode::BrNeq_A;
    IR::LabelInstr *lastLabelBeforeHelper = nullptr;

    /// Typespec'd float
    if (instr->GetSrc1()->GetType() == TyFloat64)
    {
        InsertFloatCheckForZeroOrNanBranch(instr->GetSrc1(), branchOnFalse, labelTarget, labelFallthrough, instr);
        Lowerer::InsertBranch(Js::OpCode::Br, labelFallthrough, instr);
        instr->Remove();
        return false;
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Null fast path

    if (srcValueType.HasBeenNull() || srcOriginalValueType.IsUninitialized())
    {
        if(srcValueType.IsNull())
        {
            //     jmp $false
            InsertBranch(Js::OpCode::Br, labelFalse, instr);

            // Skip lowering call to helper
            Assert(instr->m_prev->IsBranchInstr());
            instr->Remove();
            return false;
        }

        //     cmp src, null
        //     je $false
        InsertCompareBranch(
            src,
            LoadLibraryValueOpnd(instr, LibraryValue::ValueNull),
            Js::OpCode::BrEq_A,
            labelFalse,
            instr);

        src->SetValueType(srcValueType = srcValueType.SetIsNotAnyOf(ValueType::Null));
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Undefined fast path

    if(srcValueType.HasBeenUndefined() || srcOriginalValueType.IsUninitialized())
    {
        if(srcValueType.IsUndefined())
        {
            //     jmp $false
            InsertBranch(Js::OpCode::Br, labelFalse, instr);

            // Skip lowering call to helper
            Assert(instr->m_prev->IsBranchInstr());
            instr->Remove();
            return false;
        }

        //     cmp src, undefined
        //     je $false
        InsertCompareBranch(
            src,
            LoadLibraryValueOpnd(instr, LibraryValue::ValueUndefined),
            Js::OpCode::BrEq_A,
            labelFalse,
            instr);

        src->SetValueType(srcValueType = srcValueType.SetIsNotAnyOf(ValueType::Undefined));
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Tagged int fast path

    const bool isNotInt = src->IsNotInt();
    bool checkedForTaggedInt = isNotInt;
    if( (
            srcValueType.HasBeenInt() ||
            srcValueType.HasBeenUnknownNumber() ||
            srcOriginalValueType.IsUninitialized()
        ) && !isNotInt)
    {
        checkedForTaggedInt = true;
        IR::LabelInstr *notTaggedIntLabel = nullptr;
        if(!src->IsTaggedInt())
        {
            //     test src, 1
            //     jz $notTaggedInt
            notTaggedIntLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
            m_lowererMD.GenerateSmIntTest(src, instr, notTaggedIntLabel);
        }

        //     cmp src, tag(0)
        //     je/jne $target
        m_lowererMD.GenerateTaggedZeroTest(src, instr);
        Lowerer::InsertBranch(compareWithFalseBranchToTargetOpCode, labelTarget, instr);

        if(src->IsTaggedInt())
        {
            // Skip lowering call to helper
            Assert(instr->m_prev->IsBranchInstr());
            instr->Remove();
            return false;
        }

        //     jmp $fallthrough
        Lowerer::InsertBranch(Js::OpCode::Br, labelFallthrough, instr);

        // $notTaggedInt:
        if(notTaggedIntLabel)
        {
            instr->InsertBefore(notTaggedIntLabel);
            lastLabelBeforeHelper = notTaggedIntLabel;
        }
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Float fast path

    bool generateFloatTest = srcValueType.IsLikelyFloat();
#ifdef _M_IX86
    if (!AutoSystemInfo::Data.SSE2Available())
    {
        generateFloatTest = false;
    }
#endif
    bool checkedForTaggedFloat =
#if FLOATVAR
        srcValueType.IsNotNumber();
#else
        true; // there are no tagged floats, indicate that it has been checked
#endif
    if (generateFloatTest)
    {
        // if(srcValueType.IsFloat()) // skip tagged int check?
        //
        // ValueType::IsFloat() does not guarantee that the storage is not in a tagged int.
        // The tagged int check is necessary. It does, however, guarantee that as long as the value is not
        // stored in a tagged int, that it is definitely stored in a JavascriptNumber/TaggedFloat.

        IR::LabelInstr *const notFloatLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
        if(!checkedForTaggedInt)
        {
            checkedForTaggedInt = true;
            m_lowererMD.GenerateSmIntTest(src, instr, notFloatLabel, nullptr, true);
        }

        //     cmp [src], JavascriptNumber::vtable
        //     jne $notFloat
    #if FLOATVAR
        checkedForTaggedFloat = true;
        IR::RegOpnd *const floatOpnd = m_lowererMD.CheckFloatAndUntag(src, instr, notFloatLabel);
    #else
        m_lowererMD.GenerateFloatTest(src, instr, notFloatLabel);
        IR::IndirOpnd *const floatOpnd = IR::IndirOpnd::New(src, Js::JavascriptNumber::GetValueOffset(), TyMachDouble, func);
    #endif

        //     cmp src, 0.0
        //     jp $false
        //     je/jne $target
        //     jmp $fallthrough
        InsertFloatCheckForZeroOrNanBranch(floatOpnd, branchOnFalse, labelTarget, labelFallthrough, instr);
        Lowerer::InsertBranch(Js::OpCode::Br, labelFallthrough, instr);

        // $notFloat:
        instr->InsertBefore(notFloatLabel);
        lastLabelBeforeHelper = notFloatLabel;

        src->SetValueType(srcValueType = srcValueType.SetIsNotAnyOf(ValueType::AnyNumber));
    }

    IR::LabelInstr *labelHelper = nullptr;
    bool _didObjectTest = checkedForTaggedInt && checkedForTaggedFloat;
    const auto EnsureObjectTest = [&]()
    {
        if(_didObjectTest)
        {
            return;
        }
        if(!labelHelper)
        {
            labelHelper = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        }
        m_lowererMD.GenerateObjectTest(src, instr, labelHelper);
        _didObjectTest = true;
    };

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Boolean fast path

    if (srcValueType.HasBeenBoolean() || srcOriginalValueType.IsUninitialized())
    {
        IR::LabelInstr *notBooleanLabel = nullptr;
        if (!srcValueType.IsBoolean())
        {
            EnsureObjectTest();

            //     cmp [src], JavascriptBoolean::vtable
            //     jne $notBoolean
            notBooleanLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
            InsertCompareBranch(
                IR::IndirOpnd::New(src, 0, TyMachPtr, func),
                LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptBoolean),
                Js::OpCode::BrNeq_A,
                notBooleanLabel,
                instr);
        }

        //     cmp src, false
        //     je/jne $target
        InsertCompareBranch(
            src,
            LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse),
            compareWithFalseBranchToTargetOpCode,
            labelTarget,
            instr);

        if (srcValueType.IsBoolean())
        {
            // Skip lowering call to helper
            Assert(!labelHelper);
            Assert(instr->m_prev->IsBranchInstr());
            instr->Remove();
            return false;
        }
        //     jmp $fallthrough
        Lowerer::InsertBranch(Js::OpCode::Br, labelFallthrough, instr);

        if (notBooleanLabel)
        {
            instr->InsertBefore(notBooleanLabel);
            lastLabelBeforeHelper = notBooleanLabel;

        }

        src->SetValueType(srcValueType = srcValueType.SetIsNotAnyOf(ValueType::Boolean));
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // String fast path

    if(srcValueType.HasBeenString())
    {
        IR::LabelInstr *notStringLabel = nullptr;
        if(!srcValueType.IsString())
        {
            EnsureObjectTest();

            notStringLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
            GenerateStringTest(src, instr, notStringLabel, nullptr, false);
        }

        //     cmp [src + offset(length)], 0
        //     jeq/jne $target
        InsertCompareBranch(
            IR::IndirOpnd::New(src, Js::JavascriptString::GetOffsetOfcharLength(), TyUint32, func),
            IR::IntConstOpnd::New(0, TyUint32, func, true),
            compareWithFalseBranchToTargetOpCode,
            labelTarget,
            instr);

        if(srcValueType.IsString())
        {
            // Skip lowering call to helper
            Assert(!labelHelper);
            Assert(instr->m_prev->IsBranchInstr());
            instr->Remove();
            return false;
        }

        //     jmp $fallthrough
        Lowerer::InsertBranch(Js::OpCode::Br, labelFallthrough, instr);

        if(notStringLabel)
        {
            instr->InsertBefore(notStringLabel);
            lastLabelBeforeHelper = notStringLabel;
        }

        src->SetValueType(srcValueType = srcValueType.SetIsNotAnyOf(ValueType::String));
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Object fast path

    if (srcValueType.IsLikelyObject())
    {
        if(srcValueType.IsObject())
        {
            if(srcValueType.GetObjectType() > ObjectType::Object)
            {
                // Specific object types that are tracked are equivalent to 'true'
                //     jmp $true
                InsertBranch(Js::OpCode::Br, labelTrue, instr);

                // Skip lowering call to helper
                Assert(!labelHelper);
                Assert(instr->m_prev->IsBranchInstr());
                instr->Remove();
                return false;
            }
        }
        else
        {
            EnsureObjectTest();
        }

        //     mov srcType, [src + offset(type)]       -- load type
        IR::RegOpnd *const srcType = IR::RegOpnd::New(TyMachPtr, func);
        const IR::AutoReuseOpnd autoReuseR1(srcType, func);
        InsertMove(srcType, IR::IndirOpnd::New(src, Js::RecyclableObject::GetOffsetOfType(), TyMachPtr, func), instr);

        //     test [srcType + offset(flags)], TypeFlagMask_IsFalsy       -- check  if falsy
        //     jnz $false
        InsertTestBranch(
            IR::IndirOpnd::New(srcType, Js::Type::GetOffsetOfFlags(), TyUint8, func),
            IR::IntConstOpnd::New(TypeFlagMask_IsFalsy, TyUint8, func),
            Js::OpCode::BrNeq_A,
            labelFalse,
            instr);

        //     cmp [srcType + offset(typeId)], TypeIds_LastJavascriptPrimitiveType  -- check base TypeIds_LastJavascriptPrimitiveType
        //     ja $true
        InsertCompareBranch(
            IR::IndirOpnd::New(srcType, Js::Type::GetOffsetOfTypeId(), TyInt32, func),
            IR::IntConstOpnd::New(Js::TypeIds_LastJavascriptPrimitiveType, TyInt32, func),
            Js::OpCode::BrGt_A,
            true /* isUnsigned */,
            labelTrue,
            instr);

        if(!labelHelper)
        {
            labelHelper = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        }
        lastLabelBeforeHelper = nullptr;
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Helper call

    // $helper:
    if(lastLabelBeforeHelper)
    {
        Assert(instr->m_prev == lastLabelBeforeHelper);
        lastLabelBeforeHelper->isOpHelper = true;
    }
    if (labelHelper)
    {
        Assert(labelHelper->isOpHelper);
        instr->InsertBefore(labelHelper);
    }

    //     call JavascriptConversion::ToBoolean
    IR::RegOpnd *const toBoolDst = IR::RegOpnd::New(TyInt32, func);
    const IR::AutoReuseOpnd autoReuseToBoolDst(toBoolDst, func);
    IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, toBoolDst, instr->GetSrc1(), func);
    instr->InsertBefore(callInstr);
    LowerUnaryHelperMem(callInstr, IR::HelperConv_ToBoolean);

    //     test eax, eax
    InsertTest(toBoolDst, toBoolDst, instr);

    //     je/jne $target
    Assert(instr->IsBranchInstr());
    instr->FreeSrc1();
    instr->m_opcode = LowererMD::MDBranchOpcode(compareWithFalseBranchToTargetOpCode);
    Assert(instr->AsBranchInstr()->GetTarget() == labelTarget);

    // Skip lowering another call to helper
    return false;
}